

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int iter_aux(lua_State *L,int strict)

{
  long lVar1;
  char *pcVar2;
  char *next;
  long lStack_38;
  utfint code;
  lua_Integer n;
  char *s;
  size_t len;
  lua_State *plStack_18;
  int strict_local;
  lua_State *L_local;
  
  len._4_4_ = strict;
  plStack_18 = L;
  n = (lua_Integer)luaL_checklstring(L,1,(size_t *)&s);
  lStack_38 = lua_tointegerx(plStack_18,2,(int *)0x0);
  lVar1 = lStack_38 + -1;
  if (lVar1 < 0) {
    lStack_38 = 0;
    lVar1 = lStack_38;
  }
  else if (lVar1 < (long)s) {
    while (lVar1 = lStack_38, ((int)*(char *)(n + lStack_38) & 0xc0U) == 0x80) {
      lStack_38 = lStack_38 + 1;
    }
  }
  lStack_38 = lVar1;
  if (lStack_38 < (long)s) {
    pcVar2 = utf8_decode((char *)(n + lStack_38),(utfint *)((long)&next + 4),len._4_4_);
    if (pcVar2 == (char *)0x0) {
      L_local._4_4_ = luaL_error(plStack_18,"invalid UTF-8 code");
    }
    else {
      lua_pushinteger(plStack_18,lStack_38 + 1);
      lua_pushinteger(plStack_18,(ulong)next._4_4_);
      L_local._4_4_ = 2;
    }
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int iter_aux (lua_State *L, int strict) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n = lua_tointeger(L, 2) - 1;
  if (n < 0)  /* first iteration? */
    n = 0;  /* start from here */
  else if (n < (lua_Integer)len) {
    n++;  /* skip current byte */
    while (iscont(s + n)) n++;  /* and its continuations */
  }
  if (n >= (lua_Integer)len)
    return 0;  /* no more codepoints */
  else {
    utfint code;
    const char *next = utf8_decode(s + n, &code, strict);
    if (next == NULL)
      return luaL_error(L, "invalid UTF-8 code");
    lua_pushinteger(L, n + 1);
    lua_pushinteger(L, code);
    return 2;
  }
}